

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall
Catch::Benchmark::Detail::BenchmarkFunction::
model<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/tests/extent_tests.cpp:199:5)>
::call(model<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ebu[P]libear_tests_extent_tests_cpp:199:5)>
       *this,Chronometer meter)

{
  Vector3d *pVVar1;
  VectorXd *pVVar2;
  int iVar3;
  ChronometerConcept *pCVar4;
  Vector3d local_58;
  double *local_40;
  long local_38;
  
  pCVar4 = meter.impl;
  iVar3 = meter.k;
  (**pCVar4->_vptr_ChronometerConcept)(pCVar4);
  if (0 < iVar3) {
    do {
      pVVar1 = (this->fun).pos;
      local_58.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
      [2] = (pVVar1->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
            array[2];
      local_58.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
      [0] = (pVVar1->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
            array[0];
      local_58.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
      [1] = (pVVar1->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
            array[1];
      pVVar2 = (this->fun).pvs;
      local_40 = (pVVar2->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                 m_data;
      local_38 = (pVVar2->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                 m_rows;
      if (local_38 < 0 && local_40 != (double *)0x0) {
        __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/MapBase.h"
                      ,0xb2,
                      "Eigen::MapBase<Eigen::Ref<Eigen::Matrix<double, -1, 1>>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Ref<Eigen::Matrix<double, -1, 1>>, Level = 0]"
                     );
      }
      ear::PolarExtent::handle
                ((this->fun).extentPanner,&local_58,*(this->fun).width,*(this->fun).height,0.0,
                 (Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> *)&local_40
                );
      iVar3 = iVar3 + -1;
    } while (iVar3 != 0);
  }
  (*pCVar4->_vptr_ChronometerConcept[1])(pCVar4);
  return;
}

Assistant:

void call(Chronometer meter) const override {
                        call(meter, is_callable<Fun(Chronometer)>());
                    }